

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

string * anon_unknown.dwarf_196f0::getIDLAbsoluteNamespace
                   (string *__return_storage_ptr__,string *type_ns,IDLExport *exporter)

{
  pointer pcVar1;
  string suffix;
  string prefix;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (type_ns->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + type_ns->_M_string_length);
  pcVar1 = (exporter->m_ns_prefix)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (exporter->m_ns_prefix)._M_string_length);
  pcVar1 = (exporter->m_ns_suffix)._M_dataplus._M_p;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + (exporter->m_ns_suffix)._M_string_length);
  if (local_68._M_string_length != 0) {
    std::operator+(&local_48,&local_68,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  if (local_80 != 0) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_88);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string getIDLAbsoluteNamespace(std::string const& type_ns, IDLExport const& exporter)
    {
        string ns = type_ns;
        string prefix = exporter.getNamespacePrefix();
        string suffix = exporter.getNamespaceSuffix();
        if (!prefix.empty())
            ns = prefix + ns;
        if (!suffix.empty())
            ns += suffix;
        return ns;
    }